

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtsc.c
# Opt level: O2

void cpu_tsc_unmark(cpu_mark_t *mark)

{
  cpu_mark_t temp;
  cpu_mark_t local_28;
  
  cpu_tsc_mark(&local_28);
  mark->tsc = local_28.tsc - mark->tsc;
  mark->sys_clock = local_28.sys_clock - mark->sys_clock;
  return;
}

Assistant:

void cpu_tsc_unmark(struct cpu_mark_t* mark)
{
	struct cpu_mark_t temp;
	cpu_tsc_mark(&temp);
	mark_t_subtract(&temp, mark, mark);
}